

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O2

int __thiscall AES256CBCDecrypt::Decrypt(AES256CBCDecrypt *this,uchar *data,int size,uchar *out)

{
  uchar *ciphertext;
  long lVar1;
  int i;
  int iVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  uchar *puVar8;
  long in_FS_OFFSET;
  bool bVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  iVar7 = 0;
  if (((((size & 0xfU) == 0) && (iVar7 = iVar2, data != (uchar *)0x0)) && (size != 0)) &&
     (out != (uchar *)0x0)) {
    bVar9 = this->pad;
    puVar8 = this->iv;
    for (uVar6 = 0; uVar6 != (uint)size; uVar6 = uVar6 + 0x10) {
      ciphertext = data + uVar6;
      AES256Decrypt::Decrypt(&this->dec,out,ciphertext);
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        out[lVar4] = out[lVar4] ^ puVar8[lVar4];
      }
      out = out + 0x10;
      puVar8 = ciphertext;
    }
    if (bVar9 == false) {
      uVar3 = 1;
    }
    else {
      bVar9 = (byte)(out[-1] - 0x11) < 0xf0;
      bVar5 = 0;
      if (!bVar9) {
        bVar5 = out[-1];
      }
      for (lVar4 = -1; (int)lVar4 != -0x11; lVar4 = lVar4 + -1) {
        bVar9 = (bool)(bVar9 | (out[lVar4] != bVar5 && (int)(0x10 - (uint)bVar5) < (int)lVar4 + 0x11
                               ));
      }
      size = size - (uint)bVar5;
      uVar3 = (byte)~bVar9 & 1;
    }
    iVar7 = size * uVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int AES256CBCDecrypt::Decrypt(const unsigned char* data, int size, unsigned char* out) const
{
    return CBCDecrypt(dec, iv, data, size, pad, out);
}